

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O2

void __thiscall RealPointDiff::test_method(RealPointDiff *this)

{
  bool bVar1;
  void *local_240;
  undefined8 local_238;
  shared_count sStack_230;
  void *local_228;
  undefined8 uStack_220;
  sp_counted_base *local_218;
  VectorXd x;
  RealScalar local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  RealSpace R7;
  undefined **local_138;
  undefined1 local_130;
  undefined8 *local_128;
  char **local_120;
  
  mnf::RealSpace::RealSpace(&R7,7);
  local_228 = (void *)0x0;
  uStack_220 = 0;
  local_218 = (sp_counted_base *)0x0;
  mnf::Manifold::createPoint();
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_240);
  mnf::Point::~Point((Point *)&local_138);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_138,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::diffRetractation((Ref_conflict *)&local_240);
  local_218 = sStack_230.pi_;
  uStack_220 = local_238;
  local_228 = local_240;
  local_240 = (void *)0x0;
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  free(local_120);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x8c);
  local_1f8 = 1e-12;
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::isIdentity
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_228,&local_1f8)
  ;
  local_240 = (void *)CONCAT71(local_240._1_7_,bVar1);
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_120 = &local_1e0;
  local_1e0 = "J.isIdentity()";
  local_1d8 = "";
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_0013ac98;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_230);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_228);
  mnf::RealSpace::~RealSpace(&R7);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RealPointDiff)
{
  RealSpace R7(7);
  Eigen::MatrixXd J;
  Eigen::VectorXd x = R7.createPoint().value();
  J = R7.diffRetractation(x);
  BOOST_CHECK(J.isIdentity());
}